

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  cmLocalGenerator *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 uVar2;
  pointer pbVar3;
  int iVar4;
  cmValue cVar5;
  cmPropertyMap *pcVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar8;
  string *psVar9;
  size_t sVar10;
  pointer ppcVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  char *pcVar13;
  ostream *poVar14;
  char *__s;
  bool bVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<bool,_const_char_*> pVar16;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string reportEntry;
  string report;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  char *local_2c0;
  cmLocalGenerator *local_2a8;
  string *local_2a0;
  undefined1 local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  cmGeneratorTarget *local_270;
  string local_268;
  string local_248;
  _Base_ptr local_228;
  _Base_ptr local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  char *local_210;
  pointer local_208;
  pointer local_200;
  undefined1 local_1f8 [112];
  ios_base local_188 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_210 = defaultValue;
  cVar5 = cmGeneratorTarget::GetProperty(tgt,p);
  if (cVar5.Value == (string *)0x0) {
    local_2c0 = (char *)0x0;
  }
  else {
    local_2c0 = ((cVar5.Value)->_M_dataplus)._M_p;
  }
  pcVar6 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_48,pcVar6);
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar15 = _Var7._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_228 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_218 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_220 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_228 != local_220 &&
      _Var7._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x17f5,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  pvVar8 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar9 = cmTarget::GetName_abi_cxx11_(tgt->Target);
    local_1f8._24_8_ = (psVar9->_M_dataplus)._M_p;
    local_1f8._16_8_ = psVar9->_M_string_length;
    local_1f8._0_8_ = (cmLocalGenerator *)0xb;
    local_1f8._8_8_ = " * Target \"";
    views._M_len = 2;
    views._M_array = (iterator)local_1f8;
    cmCatViews_abi_cxx11_(&local_248,views);
    local_278 = _Var7._M_current;
    if (_Var7._M_current != local_218) {
      std::__cxx11::string::append((char *)&local_248);
      pcVar13 = "(unset)";
      if (local_2c0 != (char *)0x0) {
        pcVar13 = local_2c0;
      }
      local_1f8._0_8_ = (cmLocalGenerator *)(local_1f8 + 0x10);
      sVar10 = strlen(pcVar13);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,pcVar13,pcVar13 + sVar10);
      std::__cxx11::string::_M_append((char *)&local_248,local_1f8._0_8_);
      _Var7._M_current = local_278;
      if ((cmLocalGenerator *)local_1f8._0_8_ != (cmLocalGenerator *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_248);
    std::operator+(&local_80,"INTERFACE_",p);
    local_2a8 = (cmLocalGenerator *)0x0;
    iVar4 = std::__cxx11::string::compare((char *)p);
    if (iVar4 == 0) {
      local_298._0_8_ = tgt->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                 (cmGeneratorTarget **)config);
      uVar2 = local_1f8._0_8_;
      __ptr = local_2a8;
      local_1f8._0_8_ = (cmLocalGenerator *)0x0;
      local_2a8 = (cmLocalGenerator *)uVar2;
      if (__ptr != (cmLocalGenerator *)0x0) {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2a8,
                   (cmGeneratorExpressionInterpreter *)__ptr);
      }
      if ((cmLocalGenerator *)local_1f8._0_8_ != (cmLocalGenerator *)0x0) {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)local_1f8,
                   (cmGeneratorExpressionInterpreter *)local_1f8._0_8_);
      }
    }
    ppcVar11 = (pvVar8->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_208 = (pvVar8->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_2a0 = p;
    if (ppcVar11 != local_208) {
      do {
        local_270 = *ppcVar11;
        local_200 = ppcVar11;
        pcVar6 = cmTarget::GetProperties(local_270->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_60,pcVar6);
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (local_60.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            local_60.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_80);
        pbVar3 = local_60.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar1 = local_218;
        pcVar13 = getTypedProperty<char_const*>
                            (local_270,&local_80,(cmGeneratorExpressionInterpreter *)local_2a8);
        local_298._0_8_ = local_298 + 0x10;
        local_298._8_8_ = 0;
        local_298[0x10] = '\0';
        if (_Var12._M_current != pbVar3) {
          std::__cxx11::string::append(local_298);
          psVar9 = cmTarget::GetName_abi_cxx11_(local_270->Target);
          std::__cxx11::string::_M_append(local_298,(ulong)(psVar9->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_298);
          __s = pcVar13;
          if (pcVar13 == (char *)0x0) {
            __s = "(unset)";
          }
          local_1f8._0_8_ = local_1f8 + 0x10;
          sVar10 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,__s,__s + sVar10);
          std::__cxx11::string::_M_append(local_298,local_1f8._0_8_);
          _Var7._M_current = local_278;
          if ((cmLocalGenerator *)local_1f8._0_8_ != (cmLocalGenerator *)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          }
          std::__cxx11::string::append(local_298);
        }
        if (_Var7._M_current == pbVar1) {
          if (local_228 == local_220) {
            if (_Var12._M_current == pbVar3) goto LAB_00374e09;
            if (bVar15) {
              pVar16 = consistentProperty<char_const*>(local_2c0,pcVar13,t);
              std::__cxx11::string::_M_append((char *)&local_248,local_298._0_8_);
              compatibilityAgree_abi_cxx11_((string *)local_1f8,t,local_2c0 != pVar16.second);
              std::__cxx11::string::_M_append((char *)&local_248,local_1f8._0_8_);
              if ((cmLocalGenerator *)local_1f8._0_8_ != (cmLocalGenerator *)(local_1f8 + 0x10)) {
                operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
              }
              pcVar13 = pVar16.second;
              if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
                _Var7._M_current = local_278;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1f8,"The INTERFACE_",0xe);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1f8,(local_2a0->_M_dataplus)._M_p,
                                     local_2a0->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," property of \"",0xe);
                psVar9 = cmTarget::GetName_abi_cxx11_(local_270->Target);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\" does\nnot agree with the value of ",0x23);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(local_2a0->_M_dataplus)._M_p,
                                     local_2a0->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," already determined\nfor \"",0x19);
                psVar9 = cmTarget::GetName_abi_cxx11_(tgt->Target);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_268);
                goto LAB_00374d01;
              }
              goto LAB_00374a78;
            }
            local_1f8._0_8_ = local_1f8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1f8,local_298._0_8_,
                       (pointer)(local_298._0_8_ + local_298._8_8_));
            std::__cxx11::string::append((char *)local_1f8);
            std::__cxx11::string::_M_append((char *)&local_248,local_1f8._0_8_);
            if ((cmLocalGenerator *)local_1f8._0_8_ != (cmLocalGenerator *)(local_1f8 + 0x10)) {
              operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
            }
            iVar4 = 0;
            bVar15 = true;
            local_2c0 = pcVar13;
          }
          else {
            iVar4 = 3;
            if (_Var12._M_current == pbVar3) {
              local_2c0 = "";
LAB_00374e09:
              iVar4 = 3;
            }
            else {
              pVar16 = consistentProperty<char_const*>("",pcVar13,t);
              std::__cxx11::string::_M_append((char *)&local_248,local_298._0_8_);
              compatibilityAgree_abi_cxx11_((string *)local_1f8,t,pVar16.second != "");
              std::__cxx11::string::_M_append((char *)&local_248,local_1f8._0_8_);
              if ((cmLocalGenerator *)local_1f8._0_8_ != (cmLocalGenerator *)(local_1f8 + 0x10)) {
                operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
              }
              local_2c0 = pVar16.second;
              if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1f8,"Property ",9);
                pcVar13 = local_210;
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1f8,(local_2a0->_M_dataplus)._M_p,
                                     local_2a0->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," on target \"",0xc);
                psVar9 = cmTarget::GetName_abi_cxx11_(tgt->Target);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\" is\nimplied to be ",0x13);
                if (pcVar13 == (char *)0x0) {
                  std::ios::clear((int)poVar14 + (int)poVar14->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar10 = strlen(pcVar13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar13,sVar10);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(local_2a0->_M_dataplus)._M_p,
                                     local_2a0->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," property on\ndependency \"",0x19);
                psVar9 = cmTarget::GetName_abi_cxx11_(local_270->Target);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_268);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p,
                                  local_268.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
                std::ios_base::~ios_base(local_188);
                iVar4 = 2;
                local_2c0 = "";
              }
            }
          }
        }
        else {
          if (_Var12._M_current == pbVar3) goto LAB_00374e09;
          pVar16 = consistentProperty<char_const*>(local_2c0,pcVar13,t);
          std::__cxx11::string::_M_append((char *)&local_248,local_298._0_8_);
          compatibilityAgree_abi_cxx11_((string *)local_1f8,t,local_2c0 != pVar16.second);
          std::__cxx11::string::_M_append((char *)&local_248,local_1f8._0_8_);
          if ((cmLocalGenerator *)local_1f8._0_8_ != (cmLocalGenerator *)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          }
          pcVar13 = pVar16.second;
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
            _Var7._M_current = local_278;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Property ",9);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f8,(local_2a0->_M_dataplus)._M_p,
                                 local_2a0->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," on target \"",0xc);
            psVar9 = cmTarget::GetName_abi_cxx11_(tgt->Target);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"\" does\nnot match the INTERFACE_",0x1f);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(local_2a0->_M_dataplus)._M_p,local_2a0->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14," property requirement\nof dependency \"",0x25);
            psVar9 = cmTarget::GetName_abi_cxx11_(local_270->Target);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\".\n",3);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_268);
LAB_00374d01:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
            std::ios_base::~ios_base(local_188);
            iVar4 = 2;
          }
          else {
LAB_00374a78:
            local_2c0 = pcVar13;
            iVar4 = 3;
            _Var7._M_current = local_278;
          }
        }
        if ((cmLocalGenerator *)local_298._0_8_ != (cmLocalGenerator *)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,CONCAT71(local_298._17_7_,local_298[0x10]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
      } while (((iVar4 == 3) || (iVar4 == 0)) && (ppcVar11 = local_200 + 1, ppcVar11 != local_208));
    }
    pcVar13 = "(unset)";
    if (local_2c0 != (char *)0x0) {
      pcVar13 = local_2c0;
    }
    local_1f8._0_8_ = (cmLocalGenerator *)(local_1f8 + 0x10);
    sVar10 = strlen(pcVar13);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,pcVar13,pcVar13 + sVar10);
    compatibilityType_abi_cxx11_((string *)local_298,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (tgt,local_2a0,(string *)local_1f8,&local_248,(string *)local_298);
    if ((cmLocalGenerator *)local_298._0_8_ != (cmLocalGenerator *)(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,CONCAT71(local_298._17_7_,local_298[0x10]) + 1);
    }
    if ((cmLocalGenerator *)local_1f8._0_8_ != (cmLocalGenerator *)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    if (local_2a8 != (cmLocalGenerator *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2a8,
                 (cmGeneratorExpressionInterpreter *)local_2a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2c0;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}